

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int yaml_parser_scan_tag_handle
              (yaml_parser_t *parser,int directive,yaml_mark_t start_mark,yaml_char_t **handle)

{
  size_t *psVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  byte *pbVar5;
  char *pcVar6;
  byte *local_58;
  byte *pbStack_50;
  byte *local_48 [2];
  yaml_mark_t *local_38;
  
  local_58 = (byte *)0x0;
  pbStack_50 = (byte *)0x0;
  local_48[0] = (byte *)0x0;
  local_58 = (byte *)yaml_malloc(0x10);
  if (local_58 == (byte *)0x0) {
LAB_001b98fe:
    parser->error = YAML_MEMORY_ERROR;
    goto LAB_001b9904;
  }
  pbStack_50 = local_58 + 0x10;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  local_58[0xe] = 0;
  local_58[0xf] = 0;
  local_48[0] = local_58;
  if ((parser->unread == 0) && (iVar3 = yaml_parser_update_buffer(parser,1), iVar3 == 0))
  goto LAB_001b9904;
  if (*(parser->buffer).pointer != '!') {
    pcVar6 = "while scanning a tag directive";
    if (directive == 0) {
      pcVar6 = "while scanning a tag";
    }
    parser->error = YAML_SCANNER_ERROR;
    parser->context = pcVar6;
    (parser->context_mark).index = start_mark.index;
    (parser->context_mark).line = start_mark.line;
    (parser->context_mark).column = start_mark.column;
    parser->problem = "did not find expected \'!\'";
    sVar4 = (parser->mark).line;
    (parser->problem_mark).index = (parser->mark).index;
    (parser->problem_mark).line = sVar4;
    sVar4 = (parser->mark).column;
LAB_001b97e8:
    (parser->problem_mark).column = sVar4;
    goto LAB_001b9904;
  }
  if ((pbStack_50 <= local_48[0] + 5) &&
     (iVar3 = yaml_string_extend(&local_58,local_48,&pbStack_50), iVar3 == 0)) goto LAB_001b98fe;
  pbVar5 = (parser->buffer).pointer;
  bVar2 = *pbVar5;
  if ((char)bVar2 < '\0') {
    if ((bVar2 & 0xe0) == 0xc0) {
LAB_001b95d6:
      (parser->buffer).pointer = pbVar5 + 1;
      *local_48[0] = *pbVar5;
      pbVar5 = (parser->buffer).pointer;
      local_48[0] = local_48[0] + 1;
      goto LAB_001b95fa;
    }
    if ((bVar2 & 0xf0) == 0xe0) {
LAB_001b95b2:
      (parser->buffer).pointer = pbVar5 + 1;
      *local_48[0] = *pbVar5;
      pbVar5 = (parser->buffer).pointer;
      local_48[0] = local_48[0] + 1;
      goto LAB_001b95d6;
    }
    if ((bVar2 & 0xf8) == 0xf0) {
      (parser->buffer).pointer = pbVar5 + 1;
      *local_48[0] = *pbVar5;
      pbVar5 = (parser->buffer).pointer;
      local_48[0] = local_48[0] + 1;
      goto LAB_001b95b2;
    }
  }
  else {
LAB_001b95fa:
    (parser->buffer).pointer = pbVar5 + 1;
    *local_48[0] = *pbVar5;
    local_48[0] = local_48[0] + 1;
  }
  (parser->mark).index = (parser->mark).index + 1;
  psVar1 = &(parser->mark).column;
  *psVar1 = *psVar1 + 1;
  psVar1 = &parser->unread;
  *psVar1 = *psVar1 - 1;
  if ((*psVar1 != 0) || (iVar3 = yaml_parser_update_buffer(parser,1), iVar3 != 0)) {
    local_38 = &parser->mark;
    do {
      bVar2 = *(parser->buffer).pointer;
      if ((((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) && (bVar2 != 0x2d)
          ) && (bVar2 != 0x5f)) {
        if (bVar2 == 0x21) {
          if ((local_48[0] + 5 < pbStack_50) ||
             (iVar3 = yaml_string_extend(&local_58,local_48,&pbStack_50), iVar3 != 0)) {
            pbVar5 = (parser->buffer).pointer;
            bVar2 = *pbVar5;
            if ((char)bVar2 < '\0') {
              if ((bVar2 & 0xe0) == 0xc0) {
LAB_001b98a3:
                (parser->buffer).pointer = pbVar5 + 1;
                *local_48[0] = *pbVar5;
                pbVar5 = (parser->buffer).pointer;
                local_48[0] = local_48[0] + 1;
                goto LAB_001b98c7;
              }
              if ((bVar2 & 0xf0) == 0xe0) {
LAB_001b987f:
                (parser->buffer).pointer = pbVar5 + 1;
                *local_48[0] = *pbVar5;
                pbVar5 = (parser->buffer).pointer;
                local_48[0] = local_48[0] + 1;
                goto LAB_001b98a3;
              }
              if ((bVar2 & 0xf8) == 0xf0) {
                (parser->buffer).pointer = pbVar5 + 1;
                *local_48[0] = *pbVar5;
                pbVar5 = (parser->buffer).pointer;
                local_48[0] = local_48[0] + 1;
                goto LAB_001b987f;
              }
            }
            else {
LAB_001b98c7:
              (parser->buffer).pointer = pbVar5 + 1;
              *local_48[0] = *pbVar5;
            }
            (parser->mark).index = (parser->mark).index + 1;
            psVar1 = &(parser->mark).column;
            *psVar1 = *psVar1 + 1;
            parser->unread = parser->unread - 1;
LAB_001b9986:
            *handle = local_58;
            return 1;
          }
          goto LAB_001b98fe;
        }
        if ((directive == 0) || ((*local_58 == 0x21 && (local_58[1] == 0)))) goto LAB_001b9986;
        parser->error = YAML_SCANNER_ERROR;
        parser->context = "while parsing a tag directive";
        (parser->context_mark).index = start_mark.index;
        (parser->context_mark).line = start_mark.line;
        (parser->context_mark).column = start_mark.column;
        parser->problem = "did not find expected \'!\'";
        sVar4 = local_38->line;
        (parser->problem_mark).index = local_38->index;
        (parser->problem_mark).line = sVar4;
        sVar4 = local_38->column;
        goto LAB_001b97e8;
      }
      if ((pbStack_50 <= local_48[0] + 5) &&
         (iVar3 = yaml_string_extend(&local_58,local_48,&pbStack_50), iVar3 == 0))
      goto LAB_001b98fe;
      pbVar5 = (parser->buffer).pointer;
      bVar2 = *pbVar5;
      if ((char)bVar2 < '\0') {
        if ((bVar2 & 0xe0) == 0xc0) {
LAB_001b9728:
          (parser->buffer).pointer = pbVar5 + 1;
          *local_48[0] = *pbVar5;
          pbVar5 = (parser->buffer).pointer;
          local_48[0] = local_48[0] + 1;
          goto LAB_001b974c;
        }
        if ((bVar2 & 0xf0) == 0xe0) {
LAB_001b9704:
          (parser->buffer).pointer = pbVar5 + 1;
          *local_48[0] = *pbVar5;
          pbVar5 = (parser->buffer).pointer;
          local_48[0] = local_48[0] + 1;
          goto LAB_001b9728;
        }
        if ((bVar2 & 0xf8) == 0xf0) {
          (parser->buffer).pointer = pbVar5 + 1;
          *local_48[0] = *pbVar5;
          pbVar5 = (parser->buffer).pointer;
          local_48[0] = local_48[0] + 1;
          goto LAB_001b9704;
        }
      }
      else {
LAB_001b974c:
        (parser->buffer).pointer = pbVar5 + 1;
        *local_48[0] = *pbVar5;
        local_48[0] = local_48[0] + 1;
      }
      (parser->mark).index = (parser->mark).index + 1;
      psVar1 = &(parser->mark).column;
      *psVar1 = *psVar1 + 1;
      psVar1 = &parser->unread;
      *psVar1 = *psVar1 - 1;
    } while ((*psVar1 != 0) || (iVar3 = yaml_parser_update_buffer(parser,1), iVar3 != 0));
  }
LAB_001b9904:
  yaml_free(local_58);
  return 0;
}

Assistant:

static int
yaml_parser_scan_tag_handle(yaml_parser_t *parser, int directive,
        yaml_mark_t start_mark, yaml_char_t **handle)
{
    yaml_string_t string = NULL_STRING;

    if (!STRING_INIT(parser, string, INITIAL_STRING_SIZE)) goto error;

    /* Check the initial '!' character. */

    if (!CACHE(parser, 1)) goto error;

    if (!CHECK(parser->buffer, '!')) {
        yaml_parser_set_scanner_error(parser, directive ?
                "while scanning a tag directive" : "while scanning a tag",
                start_mark, "did not find expected '!'");
        goto error;
    }

    /* Copy the '!' character. */

    if (!READ(parser, string)) goto error;

    /* Copy all subsequent alphabetical and numerical characters. */

    if (!CACHE(parser, 1)) goto error;

    while (IS_ALPHA(parser->buffer))
    {
        if (!READ(parser, string)) goto error;
        if (!CACHE(parser, 1)) goto error;
    }

    /* Check if the trailing character is '!' and copy it. */

    if (CHECK(parser->buffer, '!'))
    {
        if (!READ(parser, string)) goto error;
    }
    else
    {
        /*
         * It's either the '!' tag or not really a tag handle.  If it's a %TAG
         * directive, it's an error.  If it's a tag token, it must be a part of
         * URI.
         */

        if (directive && !(string.start[0] == '!' && string.start[1] == '\0')) {
            yaml_parser_set_scanner_error(parser, "while parsing a tag directive",
                    start_mark, "did not find expected '!'");
            goto error;
        }
    }

    *handle = string.start;

    return 1;

error:
    STRING_DEL(parser, string);
    return 0;
}